

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::changeCol
          (SPxSolverBase<double> *this,int i,LPColBase<double> *newCol,bool scale)

{
  if (-1 < i) {
    this->m_nonbasicValue = 0.0;
    this->m_nonbasicValueUpToDate = false;
    SPxLPBase<double>::changeCol(&this->super_SPxLPBase<double>,i,newCol,scale);
    if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
      SPxBasisBase<double>::invalidate(&this->super_SPxBasisBase<double>);
      SPxBasisBase<double>::restoreInitialBasis(&this->super_SPxBasisBase<double>);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeCol(int i, const LPColBase<R>& newCol, bool scale)
{
   if(i < 0)
      return;

   forceRecompNonbasicValue();

   SPxLPBase<R>::changeCol(i, newCol, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      SPxBasisBase<R>::changedCol(i);

   unInit();
}